

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_small_vector.cpp
# Opt level: O3

void __thiscall
SmallVector_IteratorConstReverse_Test::TestBody(SmallVector_IteratorConstReverse_Test *this)

{
  char *message;
  vector<int,_std::allocator<int>_> actual;
  small_vector<int,_4UL> buffer;
  AssertHelper local_90;
  allocator_type local_88 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_80;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_78;
  undefined8 uStack_70;
  void *local_68 [2];
  long local_58;
  reverse_iterator<pstore::pointer_based_iterator<const_int>_> local_50;
  reverse_iterator<pstore::pointer_based_iterator<const_int>_> local_48;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 uStack_30;
  void *local_28;
  undefined8 uStack_20;
  long local_18;
  pointer local_10;
  
  local_50.current.pos_ = (pointer_based_iterator<const_int>)&local_38;
  local_40 = 4;
  local_28 = (void *)0x0;
  uStack_20 = 0;
  local_18 = 0;
  local_38 = 0x2b0000002a;
  uStack_30 = 0x2d0000002c;
  local_48.current.pos_ = (pointer_based_iterator<const_int>)&local_28;
  local_10 = (pointer)local_50.current.pos_;
  std::vector<int,std::allocator<int>>::
  vector<std::reverse_iterator<pstore::pointer_based_iterator<int_const>>,void>
            ((vector<int,std::allocator<int>> *)local_68,&local_48,&local_50,local_88);
  local_78._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2b0000002a;
  uStack_70 = 0x2d0000002c;
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::ElementsAreMatcher<std::tuple<int,int,int,int>>>
  ::operator()(local_88,(char *)&local_78,(vector<int,_std::allocator<int>_> *)"actual");
  if (local_88[0] == (allocator_type)0x0) {
    testing::Message::Message((Message *)&local_78);
    if (local_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = (local_80->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_small_vector.cpp"
               ,0xd8,message);
    testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper(&local_90);
    if (local_78._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_78._M_head_impl + 8))();
    }
  }
  if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_80,local_80);
  }
  if (local_68[0] != (void *)0x0) {
    operator_delete(local_68[0],local_58 - (long)local_68[0]);
  }
  if (local_28 != (void *)0x0) {
    operator_delete(local_28,local_18 - (long)local_28);
  }
  return;
}

Assistant:

TEST (SmallVector, SizeAfterResizeLarger) {
    pstore::small_vector<int, 4> b (std::size_t{4});
    std::size_t const size{10};
    b.resize (size);
    EXPECT_EQ (size, b.size ());
    EXPECT_GE (size, b.capacity ())
        << "expected capacity to be at least " << size << " (the container size)";
}